

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::u32string,std::__cxx11::u32string>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *lhs,
          char *op,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                   *rhs)

{
  size_t sVar1;
  char *__dest;
  anon_union_24_2_13149d16_for_String_3 local_88;
  anon_union_24_2_13149d16_for_String_3 local_70;
  anon_union_24_2_13149d16_for_String_3 local_58;
  anon_union_24_2_13149d16_for_String_3 local_40;
  
  local_40.buf[0x17] = '\x14';
  local_40._0_4_ = 0x7d3f7b;
  sVar1 = strlen((char *)lhs);
  __dest = String::allocate((String *)&local_70.data,(size_type)sVar1);
  memcpy(__dest,lhs,sVar1 & 0xffffffff);
  operator+((String *)&local_88.data,(String *)&local_40.data,(String *)&local_70.data);
  local_58.buf[0x17] = '\x14';
  local_58._0_4_ = 0x7d3f7b;
  operator+(__return_storage_ptr__,(String *)&local_88.data,(String *)&local_58.data);
  if ((local_88.buf[0x17] < '\0') && (local_88.data.ptr != (char *)0x0)) {
    operator_delete__(local_88.data.ptr);
  }
  if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
    operator_delete__(local_70.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }